

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

int archive_write_mtree_options(archive_write *a,char *key,char *value)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = -0x14;
  if (0x14 < (byte)*key - 0x61) {
    return -0x14;
  }
  pvVar1 = a->format_data;
  switch((uint)(byte)*key) {
  case 0x61:
    iVar2 = strcmp(key,"all");
    if (iVar2 != 0) {
      return -0x14;
    }
    uVar3 = 0xffffffff;
    break;
  default:
    goto switchD_0014b88a_caseD_62;
  case 99:
    iVar2 = strcmp(key,"cksum");
    if (iVar2 != 0) {
      return -0x14;
    }
    uVar3 = 1;
    break;
  case 100:
    iVar2 = strcmp(key,"device");
    if (iVar2 == 0) {
      uVar3 = 2;
      break;
    }
    iVar2 = strcmp(key,"dironly");
    if (iVar2 != 0) {
      return -0x14;
    }
    *(uint *)((long)pvVar1 + 0xf4) = (uint)(value != (char *)0x0);
    goto LAB_0014bc27;
  case 0x66:
    iVar2 = strcmp(key,"flags");
    if (iVar2 != 0) {
      return -0x14;
    }
    uVar3 = 8;
    break;
  case 0x67:
    iVar2 = strcmp(key,"gid");
    if (iVar2 == 0) {
      uVar3 = 0x10;
    }
    else {
      iVar2 = strcmp(key,"gname");
      if (iVar2 != 0) {
        return -0x14;
      }
      uVar3 = 0x20;
    }
    break;
  case 0x69:
    iVar2 = strcmp(key,"indent");
    if (iVar2 == 0) {
      *(uint *)((long)pvVar1 + 0xf8) = (uint)(value != (char *)0x0);
      goto LAB_0014bc27;
    }
    iVar2 = strcmp(key,"inode");
    if (iVar2 != 0) {
      return -0x14;
    }
    uVar3 = 0x4000000;
    break;
  case 0x6c:
    iVar2 = strcmp(key,"link");
    if (iVar2 != 0) {
      return -0x14;
    }
    uVar3 = 0x10000;
    break;
  case 0x6d:
    iVar2 = strcmp(key,"md5");
    if (iVar2 == 0) {
LAB_0014bb48:
      uVar3 = 0x100;
    }
    else {
      iVar2 = strcmp(key,"md5digest");
      uVar3 = 0;
      if (iVar2 == 0) goto LAB_0014bb48;
    }
    iVar2 = strcmp(key,"mode");
    if (iVar2 == 0) {
      uVar3 = 0x200;
    }
    else {
LAB_0014bb65:
      if (uVar3 == 0) {
        return -0x14;
      }
    }
    break;
  case 0x6e:
    iVar2 = strcmp(key,"nlink");
    if (iVar2 != 0) {
      return -0x14;
    }
    uVar3 = 0x400;
    break;
  case 0x72:
    iVar2 = strcmp(key,"resdevice");
    if (iVar2 == 0) {
      uVar3 = 0x8000000;
    }
    else {
      iVar2 = strcmp(key,"ripemd160digest");
      uVar3 = 0x2000;
      if (((iVar2 != 0) && (iVar2 = strcmp(key,"rmd160"), iVar2 != 0)) &&
         (iVar2 = strcmp(key,"rmd160digest"), iVar2 != 0)) {
        return -0x14;
      }
    }
    break;
  case 0x73:
    iVar2 = strcmp(key,"sha1");
    if (iVar2 == 0) {
LAB_0014b8d3:
      uVar3 = 0x4000;
    }
    else {
      iVar2 = strcmp(key,"sha1digest");
      uVar3 = 0;
      if (iVar2 == 0) goto LAB_0014b8d3;
    }
    iVar2 = strcmp(key,"sha256");
    if ((iVar2 == 0) || (iVar2 = strcmp(key,"sha256digest"), iVar2 == 0)) {
      uVar3 = 0x800000;
    }
    iVar2 = strcmp(key,"sha384");
    if ((iVar2 == 0) || (iVar2 = strcmp(key,"sha384digest"), iVar2 == 0)) {
      uVar3 = 0x1000000;
    }
    iVar2 = strcmp(key,"sha512");
    if ((iVar2 == 0) || (iVar2 = strcmp(key,"sha512digest"), iVar2 == 0)) {
      uVar3 = 0x2000000;
    }
    iVar2 = strcmp(key,"size");
    if (iVar2 != 0) goto LAB_0014bb65;
    uVar3 = 0x8000;
    break;
  case 0x74:
    iVar2 = strcmp(key,"time");
    if (iVar2 == 0) {
      uVar3 = 0x40000;
    }
    else {
      iVar2 = strcmp(key,"type");
      if (iVar2 != 0) {
        return -0x14;
      }
      uVar3 = 0x80000;
    }
    break;
  case 0x75:
    iVar2 = strcmp(key,"uid");
    if (iVar2 == 0) {
      uVar3 = 0x100000;
    }
    else {
      iVar2 = strcmp(key,"uname");
      if (iVar2 != 0) {
        iVar2 = strcmp(key,"use-set");
        if (iVar2 != 0) {
          return -0x14;
        }
        *(uint *)((long)pvVar1 + 0xfc) = (uint)(value != (char *)0x0);
        goto LAB_0014bc27;
      }
      uVar3 = 0x200000;
    }
  }
  if (value == (char *)0x0) {
    *(uint *)((long)pvVar1 + 0xf0) = *(uint *)((long)pvVar1 + 0xf0) & ~uVar3;
  }
  else {
    *(uint *)((long)pvVar1 + 0xf0) = *(uint *)((long)pvVar1 + 0xf0) | uVar3;
  }
LAB_0014bc27:
  iVar2 = 0;
switchD_0014b88a_caseD_62:
  return iVar2;
}

Assistant:

static int
archive_write_mtree_options(struct archive_write *a, const char *key,
    const char *value)
{
	struct mtree_writer *mtree= a->format_data;
	int keybit = 0;

	switch (key[0]) {
	case 'a':
		if (strcmp(key, "all") == 0)
			keybit = ~0;
		break;
	case 'c':
		if (strcmp(key, "cksum") == 0)
			keybit = F_CKSUM;
		break;
	case 'd':
		if (strcmp(key, "device") == 0)
			keybit = F_DEV;
		else if (strcmp(key, "dironly") == 0) {
			mtree->dironly = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		}
		break;
	case 'f':
		if (strcmp(key, "flags") == 0)
			keybit = F_FLAGS;
		break;
	case 'g':
		if (strcmp(key, "gid") == 0)
			keybit = F_GID;
		else if (strcmp(key, "gname") == 0)
			keybit = F_GNAME;
		break;
	case 'i':
		if (strcmp(key, "indent") == 0) {
			mtree->indent = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		} else if (strcmp(key, "inode") == 0) {
			keybit = F_INO;
		}
		break;
	case 'l':
		if (strcmp(key, "link") == 0)
			keybit = F_SLINK;
		break;
	case 'm':
		if (strcmp(key, "md5") == 0 ||
		    strcmp(key, "md5digest") == 0)
			keybit = F_MD5;
		if (strcmp(key, "mode") == 0)
			keybit = F_MODE;
		break;
	case 'n':
		if (strcmp(key, "nlink") == 0)
			keybit = F_NLINK;
		break;
	case 'r':
		if (strcmp(key, "resdevice") == 0) {
			keybit = F_RESDEV;
		} else if (strcmp(key, "ripemd160digest") == 0 ||
		    strcmp(key, "rmd160") == 0 ||
		    strcmp(key, "rmd160digest") == 0)
			keybit = F_RMD160;
		break;
	case 's':
		if (strcmp(key, "sha1") == 0 ||
		    strcmp(key, "sha1digest") == 0)
			keybit = F_SHA1;
		if (strcmp(key, "sha256") == 0 ||
		    strcmp(key, "sha256digest") == 0)
			keybit = F_SHA256;
		if (strcmp(key, "sha384") == 0 ||
		    strcmp(key, "sha384digest") == 0)
			keybit = F_SHA384;
		if (strcmp(key, "sha512") == 0 ||
		    strcmp(key, "sha512digest") == 0)
			keybit = F_SHA512;
		if (strcmp(key, "size") == 0)
			keybit = F_SIZE;
		break;
	case 't':
		if (strcmp(key, "time") == 0)
			keybit = F_TIME;
		else if (strcmp(key, "type") == 0)
			keybit = F_TYPE;
		break;
	case 'u':
		if (strcmp(key, "uid") == 0)
			keybit = F_UID;
		else if (strcmp(key, "uname") == 0)
			keybit = F_UNAME;
		else if (strcmp(key, "use-set") == 0) {
			mtree->output_global_set = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		}
		break;
	}
	if (keybit != 0) {
		if (value != NULL)
			mtree->keys |= keybit;
		else
			mtree->keys &= ~keybit;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}